

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_tcp.c
# Opt level: O0

int test_object(void)

{
  int iVar1;
  tnt_stream *s_00;
  size_t sVar2;
  ssize_t sVar3;
  int res_101;
  int res_100;
  int res_99;
  int i;
  int res_98;
  int res_97;
  int res_96;
  int res_95;
  int res_94;
  int res_93;
  int res_92;
  int res_91;
  int res_90;
  int res_89;
  int res_88;
  int res_87;
  int res_86;
  int res_85;
  int res_84;
  int res_83;
  int res_82;
  int res_81;
  int res_80;
  int res_79;
  int res_78;
  int res_77;
  int res_76;
  int res_75;
  int res_74;
  int res_73;
  int res_72;
  int res_71;
  int res_70;
  int res_69;
  int res_68;
  int res_67;
  int res_66;
  int res_65;
  int res_64;
  int res_63;
  int res_62;
  int res_61;
  int res_60;
  int res_59;
  int res_58;
  int res_57;
  int res_56;
  int res_55;
  int res_54;
  int res_53;
  int res_52;
  int res_51;
  int res_50;
  int res_49;
  int res_48;
  int res_47;
  int res_46;
  int res_45;
  int res_44;
  int res_43;
  int res_42;
  int res_41;
  int res_40;
  int res_39;
  int res_38;
  int res_37;
  int res_36;
  int res_35;
  int res_34;
  int res_33;
  int res_32;
  int res_31;
  int res_30;
  int res_29;
  int res_28;
  int res_27;
  int res_26;
  int res_25;
  int res_24;
  int res_23;
  int res_22;
  int res_21;
  int res_20;
  int res_19;
  int res_18;
  int res_17;
  int res_16;
  int res_15;
  int res_14;
  int res_13;
  int res_12;
  int res_11;
  int res_10;
  int res_9;
  int res_8;
  int res_7;
  int res_6;
  int res_5;
  int res_4;
  int res_3;
  int res_2;
  int res_1;
  int res;
  ssize_t str1_len;
  char str1 [29];
  tnt_stream *s;
  
  plan(0x66);
  __space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"*** %s: prep ***","test_object");
  fprintf(_stdout,"\n");
  s_00 = tnt_object((tnt_stream *)0x0);
  str1_len._0_1_ = 'I';
  str1_len._1_1_ = '\'';
  str1_len._2_1_ = 'm';
  str1_len._3_1_ = ' ';
  str1_len._4_1_ = 't';
  str1_len._5_1_ = 'o';
  str1_len._6_1_ = 't';
  str1_len._7_1_ = 'a';
  builtin_strncpy(str1,"ly duck, i can quack",0x15);
  sVar2 = strlen((char *)&str1_len);
  iVar1 = __ok((uint)(s_00 != (tnt_stream *)0x0),"Checking that object is allocated");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Checking that object is allocated");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,99);
  }
  iVar1 = __ok((uint)(s_00->alloc == 1),"Checking s->alloc");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Checking s->alloc");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,100);
  }
  sVar3 = tnt_object_add_int(s_00,0x4bb);
  iVar1 = __ok((uint)(sVar3 == 3),"encoding int > 0");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding int > 0");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x65);
  }
  sVar3 = tnt_object_add_int(s_00,-0x4bb);
  iVar1 = __ok((uint)(sVar3 == 3),"encoding int < 0");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding int < 0");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x66);
  }
  sVar3 = tnt_object_add_nil(s_00);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding nil");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x67);
  }
  sVar3 = tnt_object_add_str(s_00,(char *)&str1_len,(uint32_t)sVar2);
  iVar1 = __ok((uint)(sVar3 == sVar2 + 1),"encoding str");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding str");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x68);
  }
  sVar3 = tnt_object_add_strz(s_00,(char *)&str1_len);
  iVar1 = __ok((uint)(sVar3 == sVar2 + 1),"encoding strz");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding strz");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x69);
  }
  iVar1 = tnt_object_type(s_00,TNT_SBO_SPARSE);
  iVar1 = __ok((uint)(iVar1 == -1),"Check type set (must fail)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Check type set (must fail)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x6b);
  }
  iVar1 = tnt_object_reset(s_00);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Reset bytestring");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x6d);
  }
  iVar1 = tnt_object_type(s_00,TNT_SBO_SPARSE);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Check type set (must be ok)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x6e);
  }
  sVar3 = tnt_object_add_array(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 5),"Sparse array");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Sparse array");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x6f);
  }
  sVar3 = tnt_object_add_nil(s_00);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding nil");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x70);
  }
  sVar3 = tnt_object_add_nil(s_00);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding nil");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x71);
  }
  sVar3 = tnt_object_add_nil(s_00);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding nil");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x72);
  }
  sVar3 = tnt_object_add_nil(s_00);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding nil");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x73);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing container");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Closing container");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x74);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == -1),"Erroneous container close");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Erroneous container close");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x75);
  }
  iVar1 = tnt_object_reset(s_00);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Reset bytestring");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x78);
  }
  iVar1 = tnt_object_type(s_00,TNT_SBO_PACKED);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Check type set (must be ok)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x79);
  }
  sVar3 = tnt_object_add_array(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 1),"Packed array");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Packed array");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7a);
  }
  sVar3 = tnt_object_add_nil(s_00);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding nil");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7b);
  }
  sVar3 = tnt_object_add_nil(s_00);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding nil");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7c);
  }
  sVar3 = tnt_object_add_nil(s_00);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding nil");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7d);
  }
  sVar3 = tnt_object_add_nil(s_00);
  iVar1 = __ok((uint)(sVar3 == 1),"encoding nil");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"encoding nil");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7e);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing container");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Closing container");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x7f);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == -1),"Erroneous container close");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Erroneous container close");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x80);
  }
  iVar1 = tnt_object_reset(s_00);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Reset bytestring");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x91);
  }
  iVar1 = tnt_object_type(s_00,TNT_SBO_PACKED);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Check type set (must be ok)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x92);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 1),"Packing map-1");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Packing map-1");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x93);
  }
  sVar3 = tnt_object_add_strz(s_00,"menu");
  iVar1 = __ok((uint)(sVar3 == 5),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x94);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 1),"   Packing value (map-2)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"   Packing value (map-2)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x95);
  }
  sVar3 = tnt_object_add_strz(s_00,"popup");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x96);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 1),"   Packing value (map-3)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"   Packing value (map-3)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x97);
  }
  sVar3 = tnt_object_add_strz(s_00,"menuitem");
  iVar1 = __ok((uint)(sVar3 == 9),"     Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"     Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x98);
  }
  sVar3 = tnt_object_add_array(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 1),"      Packing value (array)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"      Packing value (array)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x99);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 1),"        Packing value (map-4)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Packing value (map-4)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9a);
  }
  sVar3 = tnt_object_add_strz(s_00,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9b);
  }
  sVar3 = tnt_object_add_strz(s_00,"CreateNewDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xf),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9c);
  }
  sVar3 = tnt_object_add_strz(s_00,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9d);
  }
  sVar3 = tnt_object_add_strz(s_00,"New");
  iVar1 = __ok((uint)(sVar3 == 4),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9e);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-4");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Closing map-4");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0x9f);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 1),"        Packing value (map-5)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Packing value (map-5)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa0);
  }
  sVar3 = tnt_object_add_strz(s_00,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa1);
  }
  sVar3 = tnt_object_add_strz(s_00,"OpenDoc()");
  iVar1 = __ok((uint)(sVar3 == 10),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa2);
  }
  sVar3 = tnt_object_add_strz(s_00,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa3);
  }
  sVar3 = tnt_object_add_strz(s_00,"Open");
  iVar1 = __ok((uint)(sVar3 == 5),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa4);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-5");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Closing map-5");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa5);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 1),"        Packing value (map-6)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Packing value (map-6)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa6);
  }
  sVar3 = tnt_object_add_strz(s_00,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa7);
  }
  sVar3 = tnt_object_add_strz(s_00,"CloseDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xb),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa8);
  }
  sVar3 = tnt_object_add_strz(s_00,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xa9);
  }
  sVar3 = tnt_object_add_strz(s_00,"Close");
  iVar1 = __ok((uint)(sVar3 == 6),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xaa);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-6");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Closing map-6");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xab);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"      Closing map-3");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"      Closing map-3");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xac);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"    Closing array");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"    Closing array");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xad);
  }
  sVar3 = tnt_object_add_strz(s_00,"id");
  iVar1 = __ok((uint)(sVar3 == 3),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xae);
  }
  sVar3 = tnt_object_add_strz(s_00,"file");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"   Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xaf);
  }
  sVar3 = tnt_object_add_strz(s_00,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb0);
  }
  sVar3 = tnt_object_add_strz(s_00,"File");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"   Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb1);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"  Closing map-2");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Closing map-2");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb2);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing map-1");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Closing map-1");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb3);
  }
  iVar1 = tnt_object_reset(s_00);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Reset bytestring");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb5);
  }
  iVar1 = tnt_object_type(s_00,TNT_SBO_SPARSE);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Check type set (must be ok)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb6);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 5),"Packing map-1");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Packing map-1");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb7);
  }
  sVar3 = tnt_object_add_strz(s_00,"menu");
  iVar1 = __ok((uint)(sVar3 == 5),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb8);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (map-2)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"   Packing value (map-2)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xb9);
  }
  sVar3 = tnt_object_add_strz(s_00,"popup");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xba);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (map-3)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"   Packing value (map-3)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbb);
  }
  sVar3 = tnt_object_add_strz(s_00,"menuitem");
  iVar1 = __ok((uint)(sVar3 == 9),"     Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"     Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbc);
  }
  sVar3 = tnt_object_add_array(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 5),"      Packing value (array)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"      Packing value (array)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbd);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 5),"        Packing value (map-4)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Packing value (map-4)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbe);
  }
  sVar3 = tnt_object_add_strz(s_00,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xbf);
  }
  sVar3 = tnt_object_add_strz(s_00,"CreateNewDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xf),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc0);
  }
  sVar3 = tnt_object_add_strz(s_00,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc1);
  }
  sVar3 = tnt_object_add_strz(s_00,"New");
  iVar1 = __ok((uint)(sVar3 == 4),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc2);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-4");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Closing map-4");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc3);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 5),"        Packing value (map-5)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Packing value (map-5)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc4);
  }
  sVar3 = tnt_object_add_strz(s_00,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc5);
  }
  sVar3 = tnt_object_add_strz(s_00,"OpenDoc()");
  iVar1 = __ok((uint)(sVar3 == 10),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc6);
  }
  sVar3 = tnt_object_add_strz(s_00,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,199);
  }
  sVar3 = tnt_object_add_strz(s_00,"Open");
  iVar1 = __ok((uint)(sVar3 == 5),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,200);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-5");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Closing map-5");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xc9);
  }
  sVar3 = tnt_object_add_map(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 5),"        Packing value (map-6)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Packing value (map-6)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xca);
  }
  sVar3 = tnt_object_add_strz(s_00,"onclick");
  iVar1 = __ok((uint)(sVar3 == 8),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xcb);
  }
  sVar3 = tnt_object_add_strz(s_00,"CloseDoc()");
  iVar1 = __ok((uint)(sVar3 == 0xb),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xcc);
  }
  sVar3 = tnt_object_add_strz(s_00,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"          Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"          Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xcd);
  }
  sVar3 = tnt_object_add_strz(s_00,"Close");
  iVar1 = __ok((uint)(sVar3 == 6),"           Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"           Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xce);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"        Closing map-6");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"        Closing map-6");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xcf);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"      Closing map-3");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"      Closing map-3");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd0);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"    Closing array");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"    Closing array");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd1);
  }
  sVar3 = tnt_object_add_strz(s_00,"id");
  iVar1 = __ok((uint)(sVar3 == 3),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd2);
  }
  sVar3 = tnt_object_add_strz(s_00,"file");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"   Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd3);
  }
  sVar3 = tnt_object_add_strz(s_00,"value");
  iVar1 = __ok((uint)(sVar3 == 6),"  Packing key (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Packing key (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd4);
  }
  sVar3 = tnt_object_add_strz(s_00,"File");
  iVar1 = __ok((uint)(sVar3 == 5),"   Packing value (str)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"   Packing value (str)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd5);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"  Closing map-2");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"  Closing map-2");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd6);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing map-1");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Closing map-1");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd7);
  }
  iVar1 = tnt_object_reset(s_00);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Reset bytestring");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xd9);
  }
  iVar1 = tnt_object_type(s_00,TNT_SBO_PACKED);
  iVar1 = __ok((uint)(iVar1 == 0),"Check type set (must be ok)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Check type set (must be ok)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xda);
  }
  sVar3 = tnt_object_add_array(s_00,0);
  iVar1 = __ok((uint)(sVar3 == 1),"Packing array (size more 1 byte)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Packing array (size more 1 byte)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xdb);
  }
  for (res_100 = 0; res_100 < 0x20; res_100 = res_100 + 1) {
    tnt_object_add_nil(s_00);
  }
  sVar3 = tnt_object_container_close(s_00);
  iVar1 = __ok((uint)(sVar3 == 0),"Closing array (size more 1 byte)");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Closing array (size more 1 byte)");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xdd);
  }
  iVar1 = tnt_object_reset(s_00);
  iVar1 = __ok((uint)(iVar1 == 0),"Reset bytestring");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Reset bytestring");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xdf);
  }
  sVar3 = tnt_object_format(s_00,"{%s{%s{%s[{%s%s%s%s}{%s%s%s%s}{%s%s%s%s}]}%s%s%s%s}}","menu",
                            "popup","menuitem","onclick","CreateNewDoc()","value","New","onclick",
                            "OpenDoc()","value","Open","onclick","CloseDoc()","value","Close","id",
                            "file","value","File");
  iVar1 = __ok((uint)(sVar3 != -1),"Pack with format");
  if (iVar1 == 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"Pack with format");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
            ,0xe5);
  }
  tnt_stream_free(s_00);
  __space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"*** %s: done ***","test_object");
  fprintf(_stdout,"\n");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_object() {
	plan(102);
	header();

	struct tnt_stream *s = NULL; s = tnt_object(NULL);


	char str1[] = "I'm totaly duck, i can quack";
	ssize_t str1_len = strlen(str1);

	isnt(s, NULL, "Checking that object is allocated");
	is  (s->alloc, 1, "Checking s->alloc");
	is  (tnt_object_add_int(s, 1211),  3, "encoding int > 0");
	is  (tnt_object_add_int(s, -1211), 3, "encoding int < 0");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_str(s, str1, str1_len), str1_len + 1, "encoding str");
	is  (tnt_object_add_strz(s, str1), str1_len + 1, "encoding strz");

	is  (tnt_object_type(s, TNT_SBO_SPARSE), -1, "Check type set (must fail)");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_SPARSE), 0, "Check type set (must be ok)");
	is  (tnt_object_add_array(s, 0), 5, "Sparse array");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_container_close(s), 0, "Closing container");
	is  (tnt_object_container_close(s), -1, "Erroneous container close");


	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_PACKED), 0, "Check type set (must be ok)");
	is  (tnt_object_add_array(s, 0), 1, "Packed array");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_add_nil(s), 1, "encoding nil");
	is  (tnt_object_container_close(s), 0, "Closing container");
	is  (tnt_object_container_close(s), -1, "Erroneous container close");


	/*
	 * {"menu": {
  	 *    "popup": {
    	 *      "menuitem": [
      	 *        {"value": "New", "onclick": "CreateNewDoc()"},
      	 *        {"value": "Open", "onclick": "OpenDoc()"},
      	 *        {"value": "Close", "onclick": "CloseDoc()"}
    	 *      ]
  	 *    }
	 *    "id": "file",
  	 *    "value": "File",
	 * }}
	 */

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_PACKED), 0, "Check type set (must be ok)");
	is  (tnt_object_add_map(s, 0), 1,			"Packing map-1");
	is  (tnt_object_add_strz(s, "menu"), 5,			"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 1,			"   Packing value (map-2)");
	is  (tnt_object_add_strz(s, "popup"), 6,		"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 1,			"   Packing value (map-3)");
	is  (tnt_object_add_strz(s, "menuitem"), 9,		"     Packing key (str)");
	is  (tnt_object_add_array(s, 0), 1,			"      Packing value (array)");
	is  (tnt_object_add_map(s, 0), 1,			"        Packing value (map-4)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CreateNewDoc()"), 15,	"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "New"), 4,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-4");
	is  (tnt_object_add_map(s, 0), 1,			"        Packing value (map-5)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "OpenDoc()"), 10,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Open"), 5,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-5");
	is  (tnt_object_add_map(s, 0), 1,			"        Packing value (map-6)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CloseDoc()"), 11,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Close"), 6,		"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-6");
	is  (tnt_object_container_close(s), 0,			"      Closing map-3");
	is  (tnt_object_container_close(s), 0,			"    Closing array");
	is  (tnt_object_add_strz(s, "id"), 3,			"  Packing key (str)");
	is  (tnt_object_add_strz(s, "file"), 5,			"   Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"  Packing key (str)");
	is  (tnt_object_add_strz(s, "File"), 5,			"   Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"  Closing map-2");
	is  (tnt_object_container_close(s), 0,			"Closing map-1");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_SPARSE), 0, "Check type set (must be ok)");
	is  (tnt_object_add_map(s, 0), 5,			"Packing map-1");
	is  (tnt_object_add_strz(s, "menu"), 5,			"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 5,			"   Packing value (map-2)");
	is  (tnt_object_add_strz(s, "popup"), 6,		"  Packing key (str)");
	is  (tnt_object_add_map(s, 0), 5,			"   Packing value (map-3)");
	is  (tnt_object_add_strz(s, "menuitem"), 9,		"     Packing key (str)");
	is  (tnt_object_add_array(s, 0), 5,			"      Packing value (array)");
	is  (tnt_object_add_map(s, 0), 5,			"        Packing value (map-4)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CreateNewDoc()"), 15,	"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "New"), 4,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-4");
	is  (tnt_object_add_map(s, 0), 5,			"        Packing value (map-5)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "OpenDoc()"), 10,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Open"), 5,			"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-5");
	is  (tnt_object_add_map(s, 0), 5,			"        Packing value (map-6)");
	is  (tnt_object_add_strz(s, "onclick"), 8,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "CloseDoc()"), 11,		"           Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"          Packing key (str)");
	is  (tnt_object_add_strz(s, "Close"), 6,		"           Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"        Closing map-6");
	is  (tnt_object_container_close(s), 0,			"      Closing map-3");
	is  (tnt_object_container_close(s), 0,			"    Closing array");
	is  (tnt_object_add_strz(s, "id"), 3,			"  Packing key (str)");
	is  (tnt_object_add_strz(s, "file"), 5,			"   Packing value (str)");
	is  (tnt_object_add_strz(s, "value"), 6,		"  Packing key (str)");
	is  (tnt_object_add_strz(s, "File"), 5,			"   Packing value (str)");
	is  (tnt_object_container_close(s), 0,			"  Closing map-2");
	is  (tnt_object_container_close(s), 0,			"Closing map-1");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	is  (tnt_object_type(s, TNT_SBO_PACKED), 0, "Check type set (must be ok)");
	is  (tnt_object_add_array(s, 0), 1, "Packing array (size more 1 byte)");
	for (int i = 0; i < 32; ++i) tnt_object_add_nil(s);
	is  (tnt_object_container_close(s), 0, "Closing array (size more 1 byte)");

	is  (tnt_object_reset(s), 0, "Reset bytestring");
	isnt(tnt_object_format(s, "{%s{%s{%s[{%s%s%s%s}{%s%s%s%s}{%s%s%s%s}]}%s%s%s%s}}",
			       "menu", "popup", "menuitem",
			       "onclick", "CreateNewDoc()", "value", "New",
			       "onclick", "OpenDoc()", "value", "Open",
			       "onclick", "CloseDoc()", "value", "Close",
			       "id", "file", "value", "File"), -1, "Pack with format");

	tnt_stream_free(s);

	footer();
	return check_plan();
}